

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# igsc_cli.c
# Opt level: O3

void do_ifr_cold_1(void)

{
  fwrite("Error: Bad test type argument\n",0x1e,1,_stderr);
  return;
}

Assistant:

static int do_ifr_run_test(int argc, char *argv[])
{
    struct igsc_device_handle handle;
    const char *device_path = NULL;
    struct igsc_device_info dev_info;
    uint8_t  tiles_mask = 0;
    uint8_t test_type = 0;
    int ret;

    if (argc <= 0)
    {
        fwupd_error("Missing arguments\n");
        return ERROR_BAD_ARGUMENT;
    }

    memset(&handle, 0, sizeof(handle));

    do
    {
        if (arg_is_device(argv[0]))
        {
            if (!arg_next(&argc, &argv))
            {
                fwupd_error("No device was provided\n");
                return ERROR_BAD_ARGUMENT;
            }
            device_path = argv[0];
        }
        else if (arg_is_tile(argv[0]))
        {
            if (!arg_next(&argc, &argv))
            {
                fwupd_error("No tile provided\n");
                return ERROR_BAD_ARGUMENT;
            }
            if (arg_is_token(argv[0], "0"))
            {
                tiles_mask = IGSC_IFR_TILE_0;
            }
            else if (arg_is_token(argv[0], "1"))
            {
                tiles_mask = IGSC_IFR_TILE_1;
            }
            else if (arg_is_token(argv[0], "01") || arg_is_token(argv[0], "all"))
            {
                tiles_mask = IGSC_IFR_TILE_0 | IGSC_IFR_TILE_1;
            }
            else
            {
                fwupd_error("Bad tile number argument\n");
                return ERROR_BAD_ARGUMENT;
            }
        }
        else if (arg_is_test(argv[0]))
        {
            if (!arg_next(&argc, &argv))
            {
                fwupd_error("No test type provided\n");
                return ERROR_BAD_ARGUMENT;
            }
            if (arg_is_token(argv[0], "scan"))
            {
                test_type = 0;
            }
            else if (arg_is_token(argv[0], "array"))
            {
                test_type = 1;
            }
            else
            {
                fwupd_error("Bad test type argument\n");
                return ERROR_BAD_ARGUMENT;
            }
        }
        else
        {
            fwupd_error("Wrong argument %s\n", argv[0]);
            return ERROR_BAD_ARGUMENT;
        }
    } while(arg_next(&argc, &argv));

    if (0 == (tiles_mask & (IGSC_IFR_TILE_0 | IGSC_IFR_TILE_1)))
    {
        fwupd_error("Bad tile number argument\n");
        return ERROR_BAD_ARGUMENT;
    }

    if (device_path)
    {
        ret = igsc_device_init_by_device(&handle, device_path);
        if (ret)
        {
           ret = EXIT_FAILURE;
           fwupd_error("Cannot initialize device: %s\n", device_path);
           goto out;
        }
    }
    else
    {
        if (get_first_device_info(&dev_info))
        {
            ret = EXIT_FAILURE;
            fwupd_error("No device to work with\n");
            goto out;
        }

        ret = igsc_device_init_by_device_info(&handle, &dev_info);
        if (ret)
        {
            ret = EXIT_FAILURE;
            fwupd_error("Cannot initialize device: %s\n", dev_info.name);
            goto out;
        }
    }

    ret = run_ifr_test(&handle, test_type, tiles_mask);

out:
    igsc_device_close(&handle);
    return ret;
}